

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

void __thiscall duckdb::ProcessRemainingBatchesEvent::Schedule(ProcessRemainingBatchesEvent *this)

{
  Executor *executor;
  PhysicalBatchCopyToFile *op;
  FixedBatchCopyGlobalState *state_p;
  ClientContext *context;
  int32_t iVar1;
  TaskScheduler *this_00;
  Pipeline *pPVar2;
  ProcessRemainingBatchesTask *this_01;
  enable_shared_from_this<duckdb::Event> *object;
  ulong uVar3;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  shared_ptr<duckdb::Event,_true> local_b8;
  _Head_base<0UL,_duckdb::ProcessRemainingBatchesTask_*,_false> local_a0;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_98;
  enable_shared_from_this<duckdb::Event> local_78;
  enable_shared_from_this<duckdb::Event> *local_60;
  shared_ptr<duckdb::Pipeline,_true> *local_58;
  ulong local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = &(this->super_BasePipelineEvent).pipeline;
  local_60 = &(this->super_BasePipelineEvent).super_Event.
              super_enable_shared_from_this<duckdb::Event>;
  uVar3 = 0;
  while( true ) {
    this_00 = TaskScheduler::GetScheduler(this->context);
    iVar1 = TaskScheduler::NumberOfThreads(this_00);
    if ((ulong)(long)iVar1 <= uVar3) break;
    pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator->(local_58);
    executor = pPVar2->executor;
    local_50 = uVar3;
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_78);
    op = this->op;
    state_p = this->gstate;
    context = this->context;
    this_01 = (ProcessRemainingBatchesTask *)operator_new(0x68);
    local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_78.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_78.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ProcessRemainingBatchesTask::ProcessRemainingBatchesTask
              (this_01,executor,&local_b8,state_p,context,op);
    uVar3 = local_50;
    local_a0._M_head_impl = this_01;
    if (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.__weak_this_.internal.
                 super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ProcessRemainingBatchesTask,std::default_delete<duckdb::ProcessRemainingBatchesTask>,void>
              ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
               (unique_ptr<duckdb::ProcessRemainingBatchesTask,_std::default_delete<duckdb::ProcessRemainingBatchesTask>_>
                *)&local_a0);
    object = &(local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_enable_shared_from_this<duckdb::Event>;
    if (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      object = (enable_shared_from_this<duckdb::Event> *)0x0;
    }
    shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
              ((shared_ptr<duckdb::Task,_true> *)&local_b8,
               (enable_shared_from_this<duckdb::Task> *)object,
               (Task *)local_b8.internal.
                       super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_98,(shared_ptr<duckdb::Task,_true> *)&local_b8);
    if (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a0._M_head_impl != (ProcessRemainingBatchesTask *)0x0) {
      (*((local_a0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
    }
    uVar3 = uVar3 + 1;
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void Schedule() override {
		vector<shared_ptr<Task>> tasks;
		for (idx_t i = 0; i < idx_t(TaskScheduler::GetScheduler(context).NumberOfThreads()); i++) {
			auto process_task =
			    make_uniq<ProcessRemainingBatchesTask>(pipeline->executor, shared_from_this(), gstate, context, op);
			tasks.push_back(std::move(process_task));
		}
		D_ASSERT(!tasks.empty());
		SetTasks(std::move(tasks));
	}